

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeclarationBinder_Declarators.cpp
# Opt level: O0

Action __thiscall
psy::C::DeclarationBinder::visitIdentifierDeclarator
          (DeclarationBinder *this,IdentifierDeclaratorSyntax *node)

{
  Action AVar1;
  CoreSyntaxNodeList<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
  *pCVar2;
  Identifier *pIVar3;
  SyntaxNode *node_00;
  SyntaxToken local_b8;
  TypedefDeclarationSymbol *local_80;
  TypedefDeclarationSymbol *decl;
  TypedefNameType *tydefNameTy;
  SyntaxToken local_60;
  Identifier *local_28;
  Identifier *name;
  IdentifierDeclaratorSyntax *node_local;
  DeclarationBinder *this_local;
  
  name = (Identifier *)node;
  node_local = (IdentifierDeclaratorSyntax *)this;
  pCVar2 = &IdentifierDeclaratorSyntax::attributes(node)->
            super_CoreSyntaxNodeList<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
  ;
  AVar1 = SyntaxVisitor::
          visit<psy::C::SpecifierSyntax*,psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax*>>
                    (&this->super_SyntaxVisitor,pCVar2);
  if (AVar1 == Quit) {
    this_local._7_1_ = Quit;
  }
  else {
    if (((uint)this->field_7 & 1) == 0) {
      handleNonTypedefDeclarator(this,(DeclaratorSyntax *)name);
      IdentifierDeclaratorSyntax::identifierToken(&local_b8,(IdentifierDeclaratorSyntax *)name);
      pIVar3 = obtainName(this,&local_b8);
      nameDeclarationAtTop(this,pIVar3);
      SyntaxToken::~SyntaxToken(&local_b8);
    }
    else {
      IdentifierDeclaratorSyntax::identifierToken(&local_60,(IdentifierDeclaratorSyntax *)name);
      pIVar3 = obtainName(this,&local_60);
      SyntaxToken::~SyntaxToken(&local_60);
      local_28 = pIVar3;
      decl = (TypedefDeclarationSymbol *)
             makeType<psy::C::TypedefNameType,psy::C::Identifier_const*>(this,pIVar3);
      local_80 = bindDeclaration<psy::C::TypedefDeclarationSymbol,psy::C::TypedefNameType*>
                           (this,(SyntaxNode *)name,(TypedefNameType *)decl);
      if (local_28 == this->ptrdiff_t_) {
        SemanticModel::set_ptrdiff_t_typedef(this->semaModel_,local_80);
      }
      else if (local_28 == this->size_t_) {
        SemanticModel::set_size_t_typedef(this->semaModel_,local_80);
      }
      else if (local_28 == this->max_align_t_) {
        SemanticModel::set_max_align_t_typedef(this->semaModel_,local_80);
      }
      else if (local_28 == this->wchar_t_) {
        SemanticModel::set_wchar_t_typedef(this->semaModel_,local_80);
      }
      else if (local_28 == this->char16_t_) {
        SemanticModel::set_char16_t_typedef(this->semaModel_,local_80);
      }
      else if (local_28 == this->char32_t_) {
        SemanticModel::set_char32_t_typedef(this->semaModel_,local_80);
      }
    }
    pCVar2 = &IdentifierDeclaratorSyntax::attributes_PostIdentifier
                        ((IdentifierDeclaratorSyntax *)name)->
              super_CoreSyntaxNodeList<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
    ;
    AVar1 = SyntaxVisitor::
            visit<psy::C::SpecifierSyntax*,psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax*>>
                      (&this->super_SyntaxVisitor,pCVar2);
    if (AVar1 == Quit) {
      this_local._7_1_ = Quit;
    }
    else {
      node_00 = &IdentifierDeclaratorSyntax::initializer((IdentifierDeclaratorSyntax *)name)->
                 super_SyntaxNode;
      AVar1 = SyntaxVisitor::visit(&this->super_SyntaxVisitor,node_00);
      if (AVar1 == Quit) {
        this_local._7_1_ = Quit;
      }
      else {
        this_local._7_1_ = Skip;
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

SyntaxVisitor::Action DeclarationBinder::visitIdentifierDeclarator(const IdentifierDeclaratorSyntax* node)
{
    VISIT(node->attributes());

    if (F_.inTydefDecltor_) {
        auto name = obtainName(node->identifierToken());
        auto tydefNameTy = makeType<TypedefNameType>(name);
        auto decl = bindDeclaration<TypedefDeclarationSymbol>(node, tydefNameTy);

        if (name == ptrdiff_t_)
            semaModel_->set_ptrdiff_t_typedef(decl);
        else if (name == size_t_)
            semaModel_->set_size_t_typedef(decl);
        else if (name == max_align_t_)
            semaModel_->set_max_align_t_typedef(decl);
        else if (name == wchar_t_)
            semaModel_->set_wchar_t_typedef(decl);
        else if (name == char16_t_)
            semaModel_->set_char16_t_typedef(decl);
        else if (name == char32_t_)
            semaModel_->set_char32_t_typedef(decl);
    }
    else {
        handleNonTypedefDeclarator(node);
        nameDeclarationAtTop(obtainName(node->identifierToken()));
    }

    VISIT(node->attributes_PostIdentifier());
    VISIT(node->initializer());

    return Action::Skip;
}